

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arena_i_destroy_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                       size_t newlen)

{
  ctl_arena_t *pcVar1;
  ctl_arenas_t *pcVar2;
  int iVar3;
  uint uVar4;
  ctl_arena_t *pcVar5;
  ctl_arena_t *pcVar6;
  undefined4 uStack_40;
  uint arena_ind;
  arena_t *arena;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  iVar3 = arena_i_reset_destroy_helper
                    ((tsd_t *)mib,(size_t *)oldp,(size_t)oldlenp,newp,(size_t *)newlen,&arena_ind,
                     (size_t)&arena,(uint *)CONCAT44(arena_ind,uStack_40),(arena_t **)arena);
  if (iVar3 == 0) {
    uVar4 = duckdb_je_arena_nthreads_get(arena,false);
    iVar3 = 0xe;
    if (uVar4 == 0) {
      uVar4 = duckdb_je_arena_nthreads_get(arena,true);
      if (uVar4 == 0) {
        arena_reset_prepare_background_thread(tsd,arena_ind);
        duckdb_je_arena_reset(tsd,arena);
        iVar3 = 0;
        duckdb_je_arena_decay((tsdn_t *)tsd,arena,false,true);
        pcVar5 = arenas_i(0x1001);
        pcVar5->initialized = true;
        ctl_arena_refresh((tsdn_t *)tsd,arena,pcVar5,arena_ind,true);
        duckdb_je_arena_destroy(tsd,arena);
        pcVar6 = arenas_i((ulong)arena_ind);
        pcVar6->initialized = false;
        (pcVar6->destroyed_link).qre_next = pcVar6;
        (pcVar6->destroyed_link).qre_prev = pcVar6;
        pcVar2 = ctl_arenas;
        pcVar5 = (ctl_arenas->destroyed).qlh_first;
        if (pcVar5 != (ctl_arena_t *)0x0) {
          (pcVar6->destroyed_link).qre_next = (pcVar5->destroyed_link).qre_prev;
          (pcVar5->destroyed_link).qre_prev = pcVar6;
          pcVar1 = (((pcVar6->destroyed_link).qre_prev)->destroyed_link).qre_next;
          (pcVar6->destroyed_link).qre_prev = pcVar1;
          (((pcVar5->destroyed_link).qre_prev)->destroyed_link).qre_next = pcVar5;
          (pcVar1->destroyed_link).qre_next = pcVar6;
          pcVar6 = (pcVar6->destroyed_link).qre_next;
        }
        (pcVar2->destroyed).qlh_first = pcVar6;
        arena_reset_finish_background_thread(tsd,arena_ind);
      }
    }
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar3;
}

Assistant:

static int
arena_i_destroy_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;
	ctl_arena_t *ctl_darena, *ctl_arena;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);

	ret = arena_i_reset_destroy_helper(tsd, mib, miblen, oldp, oldlenp,
	    newp, newlen, &arena_ind, &arena);
	if (ret != 0) {
		goto label_return;
	}

	if (arena_nthreads_get(arena, false) != 0 || arena_nthreads_get(arena,
	    true) != 0) {
		ret = EFAULT;
		goto label_return;
	}

	arena_reset_prepare_background_thread(tsd, arena_ind);
	/* Merge stats after resetting and purging arena. */
	arena_reset(tsd, arena);
	arena_decay(tsd_tsdn(tsd), arena, false, true);
	ctl_darena = arenas_i(MALLCTL_ARENAS_DESTROYED);
	ctl_darena->initialized = true;
	ctl_arena_refresh(tsd_tsdn(tsd), arena, ctl_darena, arena_ind, true);
	/* Destroy arena. */
	arena_destroy(tsd, arena);
	ctl_arena = arenas_i(arena_ind);
	ctl_arena->initialized = false;
	/* Record arena index for later recycling via arenas.create. */
	ql_elm_new(ctl_arena, destroyed_link);
	ql_tail_insert(&ctl_arenas->destroyed, ctl_arena, destroyed_link);
	arena_reset_finish_background_thread(tsd, arena_ind);

	assert(ret == 0);
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);

	return ret;
}